

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O2

PermutationMatrix<_1,__1,_int> * __thiscall
Eigen::PermutationBase<Eigen::PermutationMatrix<-1,-1,int>>::operator=
          (PermutationBase<Eigen::PermutationMatrix<_1,_1,int>> *this,
          TranspositionsBase<Eigen::Transpositions<_1,__1,_int>_> *tr)

{
  uint i;
  
  PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::setIdentity
            ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)this,*(Index *)(tr + 8));
  i = *(uint *)(this + 8);
  while (0 < (int)i) {
    i = i - 1;
    PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::applyTranspositionOnTheRight
              ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)this,i,
               *(Index *)(*(long *)tr + (ulong)i * 4));
  }
  return (PermutationMatrix<_1,__1,_int> *)this;
}

Assistant:

Derived& operator=(const TranspositionsBase<OtherDerived>& tr)
    {
      setIdentity(tr.size());
      for(Index k=size()-1; k>=0; --k)
        applyTranspositionOnTheRight(k,tr.coeff(k));
      return derived();
    }